

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.hh
# Opt level: O0

string * __thiscall
tinyusdz::to_string<std::__cxx11::string>
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,uint32_t level)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference s;
  uint32_t n;
  string local_1f0;
  ulong local_1d0;
  size_t i;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  tinyusdz *ptStack_18;
  uint32_t level_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_local;
  
  local_1c = (uint)v;
  ptStack_18 = this;
  v_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pprint::Indent_abi_cxx11_((string *)&i,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&i);
  ::std::operator<<(poVar2,"[");
  ::std::__cxx11::string::~string((string *)&i);
  local_1d0 = 0;
  while( true ) {
    uVar1 = local_1d0;
    sVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ptStack_18);
    if (sVar3 <= uVar1) break;
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ptStack_18,local_1d0);
    to_string(&local_1f0,s);
    ::std::operator<<(aoStack_198,(string *)&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    uVar1 = local_1d0;
    sVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ptStack_18);
    if (uVar1 != sVar3 - 1) {
      ::std::operator<<(aoStack_198,", ");
    }
    local_1d0 = local_1d0 + 1;
  }
  ::std::operator<<(aoStack_198,"]");
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::vector<T> &v, const uint32_t level = 0) {
  std::stringstream ss;
  ss << pprint::Indent(level) << "[";

  // TODO(syoyo): indent for large array
  for (size_t i = 0; i < v.size(); i++) {
    ss << to_string(v[i]);
    if (i != (v.size() - 1)) {
      ss << ", ";
    }
  }
  ss << "]";
  return ss.str();
}